

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O3

bool __thiscall
vectorgraphics::TikzPlotter::compileTexFile(TikzPlotter *this,path *path,string *name)

{
  pointer pcVar1;
  int iVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream oss;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"cd ",3);
  pbVar3 = std::filesystem::__cxx11::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)local_190,path);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3," && lualatex --halt-on-error ",0x1d);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(pbVar3,(char *)local_1b0,local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">/dev/null",10);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  iVar2 = system((char *)local_1b0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error in compileTexFile: lualatex call not succesful",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return iVar2 == 0;
}

Assistant:

bool TikzPlotter::compileTexFile(std::filesystem::path path, std::string name) const {
    std::ostringstream oss;
    oss << "cd " << path << " && lualatex --halt-on-error " << (name + ".tex") << ">/dev/null";
    auto ret = std::system(oss.str().c_str());
    if (ret != 0) {
      std::cout << "Error in compileTexFile: lualatex call not succesful" << std::endl;
      return false;
    }
    return true;
  }